

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrGetFacialExpressionBlendShapePropertiesML
                   (XrFacialExpressionClientML facialExpressionClient,
                   XrFacialExpressionBlendShapeGetInfoML *blendShapeGetInfo,uint32_t blendShapeCount
                   ,XrFacialExpressionBlendShapePropertiesML *blendShapes)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  ostream *poVar5;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  XrFacialExpressionClientML facialExpressionClient_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  string local_4b0;
  ostringstream oss_blendShapes;
  uint auStack_478 [88];
  ostringstream oss_blendShapeCount;
  ostringstream oss_facialExpressionClient;
  uint auStack_188 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  facialExpressionClient_local = facialExpressionClient;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_facialExpressionClient,
             &g_facialexpressionclientml_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrFacialExpressionClientML_T_*,_std::pair<XrFacialExpressionClientML_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrFacialExpressionClientML_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrFacialExpressionClientML_T_*>,_std::hash<XrFacialExpressionClientML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_facialexpressionclientml_dispatch_map._M_h,&facialExpressionClient_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrFacialExpressionClientML_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrFacialExpressionClientML_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_facialExpressionClient)
  ;
  if (iVar4.
      super__Node_iterator_base<std::pair<XrFacialExpressionClientML_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[44],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",
               (char (*) [44])"xrGetFacialExpressionBlendShapePropertiesML",(char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_facialExpressionClient);
    lVar1 = *(long *)((long)&_oss_facialExpressionClient[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_facialExpressionClient);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[27],char_const(&)[23],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [27])"XrFacialExpressionClientML",
               (char (*) [23])"facialExpressionClient",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_blendShapeCount);
    std::__cxx11::string::~string((string *)&oss_blendShapeCount);
    std::__cxx11::string::string
              ((string *)&local_4b0,"blendShapeGetInfo",(allocator *)&oss_blendShapeCount);
    std::__cxx11::string::string
              ((string *)&local_4d0,"const XrFacialExpressionBlendShapeGetInfoML*",
               (allocator *)&oss_blendShapes);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,blendShapeGetInfo,&local_4b0,&local_4d0,true,&contents);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_blendShapeCount);
    poVar5 = std::operator<<((ostream *)&oss_blendShapeCount,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[16],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"uint32_t",(char (*) [16])"blendShapeCount",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_blendShapes
              );
    std::__cxx11::string::~string((string *)&oss_blendShapes);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_blendShapes);
    *(uint *)((long)auStack_478 + *(long *)(_oss_blendShapes + -0x18)) =
         *(uint *)((long)auStack_478 + *(long *)(_oss_blendShapes + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_blendShapes);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[42],char_const(&)[12],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [42])0x217a93,(char (*) [12])"blendShapes",&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_508,&contents);
    ApiDumpLayerRecordContent(&local_508);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_508);
    XVar3 = (*gen_dispatch_table->GetFacialExpressionBlendShapePropertiesML)
                      (facialExpressionClient_local,blendShapeGetInfo,blendShapeCount,blendShapes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_blendShapes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_blendShapeCount);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_facialExpressionClient);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrGetFacialExpressionBlendShapePropertiesML(
    XrFacialExpressionClientML facialExpressionClient,
    const XrFacialExpressionBlendShapeGetInfoML* blendShapeGetInfo,
    uint32_t blendShapeCount,
    XrFacialExpressionBlendShapePropertiesML* blendShapes) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_facialexpressionclientml_dispatch_mutex);
            auto map_iter = g_facialexpressionclientml_dispatch_map.find(facialExpressionClient);
            if (map_iter == g_facialexpressionclientml_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrGetFacialExpressionBlendShapePropertiesML", "");
        std::ostringstream oss_facialExpressionClient;
        oss_facialExpressionClient << std::hex << reinterpret_cast<const void*>(facialExpressionClient);
        contents.emplace_back("XrFacialExpressionClientML", "facialExpressionClient", oss_facialExpressionClient.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, blendShapeGetInfo, "blendShapeGetInfo", "const XrFacialExpressionBlendShapeGetInfoML*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_blendShapeCount;
        oss_blendShapeCount << "0x" << std::hex << (blendShapeCount);
        contents.emplace_back("uint32_t", "blendShapeCount", oss_blendShapeCount.str());
        std::ostringstream oss_blendShapes;
        oss_blendShapes << std::hex << reinterpret_cast<const void*>(blendShapes);
        contents.emplace_back("XrFacialExpressionBlendShapePropertiesML*", "blendShapes", oss_blendShapes.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->GetFacialExpressionBlendShapePropertiesML(facialExpressionClient, blendShapeGetInfo, blendShapeCount, blendShapes);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}